

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O0

void Hacl_Impl_Ed25519_Ladder_point_mul(uint64_t *result,uint8_t *scalar,uint64_t *q1)

{
  uint64_t *nqpq;
  uint64_t *nq;
  uint64_t b [80];
  uint64_t *input;
  uint64_t *output;
  uint64_t local_298 [7];
  uint64_t *in_stack_fffffffffffffda0;
  uint64_t auStack_1f8 [63];
  
  memset(local_298,0,0x280);
  output = local_298;
  input = auStack_1f8;
  Hacl_Impl_Ed25519_Ladder_make_point_inf(in_stack_fffffffffffffda0);
  Hacl_Impl_Ed25519_SwapConditional_copy(output,input);
  Hacl_Impl_Ed25519_Ladder_point_mul_(output,(uint8_t *)input);
  Hacl_Impl_Ed25519_SwapConditional_copy(output,input);
  return;
}

Assistant:

static void Hacl_Impl_Ed25519_Ladder_point_mul(uint64_t *result, uint8_t *scalar, uint64_t *q1)
{
  uint64_t b[80U] = { 0U };
  uint64_t *nq = b;
  uint64_t *nqpq = b + (uint32_t)20U;
  Hacl_Impl_Ed25519_Ladder_make_point_inf(nq);
  Hacl_Impl_Ed25519_SwapConditional_copy(nqpq, q1);
  Hacl_Impl_Ed25519_Ladder_point_mul_(b, scalar);
  Hacl_Impl_Ed25519_SwapConditional_copy(result, nq);
}